

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::mark_location_as_used_by_shader
          (CompilerMSL *this,uint32_t location,SPIRType *type,StorageClass storage,bool fallback)

{
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar1;
  value_type local_7c;
  _Node_iterator_base<unsigned_int,_false> local_78;
  undefined1 local_70;
  value_type local_68;
  uint local_64;
  _Node_iterator_base<unsigned_int,_false> _Stack_60;
  uint32_t i_1;
  undefined1 local_58;
  value_type local_4c;
  _Node_iterator_base<unsigned_int,_false> local_48;
  undefined1 local_40;
  value_type local_34;
  uint local_30;
  uint local_2c;
  uint32_t i;
  uint32_t count;
  bool fallback_local;
  SPIRType *pSStack_20;
  StorageClass storage_local;
  SPIRType *type_local;
  CompilerMSL *pCStack_10;
  uint32_t location_local;
  CompilerMSL *this_local;
  
  i._3_1_ = fallback;
  count = storage;
  pSStack_20 = type;
  type_local._4_4_ = location;
  pCStack_10 = this;
  local_2c = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,type);
  if (count == 1) {
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      local_34 = type_local._4_4_ + local_30;
      pVar1 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&this->location_inputs_in_use,&local_34);
      local_48._M_cur =
           (__node_type *)pVar1.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_40 = pVar1.second;
      if ((i._3_1_ & 1) != 0) {
        local_4c = type_local._4_4_ + local_30;
        pVar1 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(&this->location_inputs_in_use_fallback,&local_4c);
        _Stack_60._M_cur =
             (__node_type *)pVar1.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_58 = pVar1.second;
      }
    }
  }
  else if (count == 3) {
    for (local_64 = 0; local_64 < local_2c; local_64 = local_64 + 1) {
      local_68 = type_local._4_4_ + local_64;
      pVar1 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&this->location_outputs_in_use,&local_68);
      local_78._M_cur =
           (__node_type *)pVar1.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_70 = pVar1.second;
      if ((i._3_1_ & 1) != 0) {
        local_7c = type_local._4_4_ + local_64;
        ::std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert(&this->location_outputs_in_use_fallback,&local_7c);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_location_as_used_by_shader(uint32_t location, const SPIRType &type,
                                                  StorageClass storage, bool fallback)
{
	uint32_t count = type_to_location_count(type);
	switch (storage)
	{
	case StorageClassInput:
		for (uint32_t i = 0; i < count; i++)
		{
			location_inputs_in_use.insert(location + i);
			if (fallback)
				location_inputs_in_use_fallback.insert(location + i);
		}
		break;
	case StorageClassOutput:
		for (uint32_t i = 0; i < count; i++)
		{
			location_outputs_in_use.insert(location + i);
			if (fallback)
				location_outputs_in_use_fallback.insert(location + i);
		}
		break;
	default:
		return;
	}
}